

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QList<QBenchmarkResult>>::emplace<QList<QBenchmarkResult>const&>
          (QMovableArrayOps<QList<QBenchmarkResult>> *this,qsizetype i,QList<QBenchmarkResult> *args
          )

{
  long lVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  Inserter local_68;
  QArrayDataPointer<QBenchmarkResult> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar2 = QArrayDataPointer<QList<QBenchmarkResult>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<QList<QBenchmarkResult>_> *)this);
      if (qVar2 == 0) goto LAB_001315c7;
      QArrayDataPointer<QBenchmarkResult>::QArrayDataPointer
                ((QArrayDataPointer<QBenchmarkResult> *)
                 (*(long *)(this + 0x10) * 0x18 + *(long *)(this + 8)),&args->d);
LAB_001316fe:
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      goto LAB_001316bd;
    }
LAB_001315c7:
    if (i == 0) {
      qVar2 = QArrayDataPointer<QList<QBenchmarkResult>_>::freeSpaceAtBegin
                        ((QArrayDataPointer<QList<QBenchmarkResult>_> *)this);
      if (qVar2 != 0) {
        QArrayDataPointer<QBenchmarkResult>::QArrayDataPointer
                  ((QArrayDataPointer<QBenchmarkResult> *)(*(long *)(this + 8) + -0x18),&args->d);
        *(long *)(this + 8) = *(long *)(this + 8) + -0x18;
        goto LAB_001316fe;
      }
    }
  }
  local_40.d = (args->d).d;
  local_40.ptr = (args->d).ptr;
  local_40.size = (args->d).size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lVar1 = *(long *)(this + 0x10);
  QArrayDataPointer<QList<QBenchmarkResult>_>::detachAndGrow
            ((QArrayDataPointer<QList<QBenchmarkResult>_> *)this,(uint)(i == 0 && lVar1 != 0),1,
             (QList<QBenchmarkResult> **)0x0,(QArrayDataPointer<QList<QBenchmarkResult>_> *)0x0);
  if (i == 0 && lVar1 != 0) {
    lVar1 = *(long *)(this + 8);
    *(Data **)(lVar1 + -0x18) = local_40.d;
    *(QBenchmarkResult **)(lVar1 + -0x10) = local_40.ptr;
    *(qsizetype *)(lVar1 + -8) = local_40.size;
    *(long *)(this + 8) = lVar1 + -0x18;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    QMovableArrayOps<QList<QBenchmarkResult>_>::Inserter::Inserter
              (&local_68,(QArrayDataPointer<QList<QBenchmarkResult>_> *)this,i,1);
    ((local_68.displaceFrom)->d).d = local_40.d;
    ((local_68.displaceFrom)->d).ptr = local_40.ptr;
    ((local_68.displaceFrom)->d).size = local_40.size;
    local_68.displaceFrom = local_68.displaceFrom + 1;
    (local_68.data)->size = (local_68.data)->size + local_68.nInserts;
  }
  local_40.size = 0;
  local_40.ptr = (QBenchmarkResult *)0x0;
  local_40.d = (Data *)0x0;
  QArrayDataPointer<QBenchmarkResult>::~QArrayDataPointer(&local_40);
LAB_001316bd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }